

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

bool __thiscall
MeCab::FeatureIndex::buildBigramFeature
          (FeatureIndex *this,LearnerPath *path,char *rfeature,char *lfeature)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  FeatureIndex *this_00;
  char **p_00;
  char **column;
  reference ppcVar6;
  ostream *poVar7;
  int *piVar8;
  char *in_RCX;
  char *in_RDX;
  long in_RSI;
  long *in_RDI;
  int id;
  char *r_1;
  char *r;
  char *p;
  const_iterator it;
  size_t rsize;
  size_t lsize;
  scoped_fixed_array<char_*,_64> L;
  scoped_fixed_array<char_*,_64> R;
  scoped_fixed_array<char,_2048> lbuf;
  scoped_fixed_array<char,_2048> rbuf;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffdf8;
  vector<int,_std::allocator<int>_> *this_01;
  StringBuffer *in_stack_fffffffffffffe00;
  scoped_fixed_array<char_*,_64> *this_02;
  value_type_conflict2 *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffe18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe30;
  char **in_stack_fffffffffffffe38;
  ostream *in_stack_fffffffffffffe40;
  ChunkFreeList<int> *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe90;
  die local_d1;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char **local_b8;
  char **local_b0;
  __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_a8;
  char **local_a0;
  size_t local_98;
  scoped_fixed_array<char_*,_64> local_90;
  scoped_fixed_array<char_*,_64> local_78;
  scoped_fixed_array<char,_2048> local_50;
  scoped_fixed_array<char,_2048> local_38;
  char *local_20;
  char *local_18;
  long local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  scoped_fixed_array<char,_2048>::scoped_fixed_array
            ((scoped_fixed_array<char,_2048> *)in_stack_fffffffffffffe00);
  scoped_fixed_array<char,_2048>::scoped_fixed_array
            ((scoped_fixed_array<char,_2048> *)in_stack_fffffffffffffe00);
  scoped_fixed_array<char_*,_64>::scoped_fixed_array
            ((scoped_fixed_array<char_*,_64> *)in_stack_fffffffffffffe00);
  scoped_fixed_array<char_*,_64>::scoped_fixed_array
            ((scoped_fixed_array<char_*,_64> *)in_stack_fffffffffffffe00);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x16bc12);
  pcVar4 = scoped_fixed_array<char,_2048>::get(&local_50);
  sVar5 = scoped_fixed_array<char,_2048>::size(&local_50);
  strncpy(pcVar4,local_18,sVar5);
  pcVar4 = scoped_fixed_array<char,_2048>::get(&local_38);
  sVar5 = scoped_fixed_array<char,_2048>::size(&local_38);
  strncpy(pcVar4,local_20,sVar5);
  scoped_fixed_array<char,_2048>::get(&local_50);
  scoped_fixed_array<char_*,_64>::get(&local_90);
  scoped_fixed_array<char_*,_64>::size(&local_90);
  local_98 = tokenizeCSV<char**>((char *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                                 in_stack_fffffffffffffe30);
  scoped_fixed_array<char,_2048>::get(&local_38);
  this_00 = (FeatureIndex *)scoped_fixed_array<char_*,_64>::get(&local_78);
  p_00 = (char **)scoped_fixed_array<char_*,_64>::size(&local_78);
  column = (char **)tokenizeCSV<char**>((char *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                                        in_stack_fffffffffffffe30);
  local_a0 = column;
  local_b0 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                                (in_stack_fffffffffffffdf8);
  __gnu_cxx::
  __normal_iterator<char_const*const*,std::vector<char_const*,std::allocator<char_const*>>>::
  __normal_iterator<char_const**>
            ((__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              *)in_stack_fffffffffffffe00,
             (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              *)in_stack_fffffffffffffdf8);
  do {
    local_b8 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                                  (in_stack_fffffffffffffdf8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                        *)in_stack_fffffffffffffe00,
                       (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                        *)in_stack_fffffffffffffdf8);
    if (!bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00,
                 (value_type_conflict2 *)in_stack_fffffffffffffdf8);
      this_02 = (scoped_fixed_array<char_*,_64> *)(in_RDI + 4);
      std::vector<int,_std::allocator<int>_>::size
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 1));
      piVar8 = ChunkFreeList<int>::alloc
                         (in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
      *(int **)(local_10 + 0x28) = piVar8;
      this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 1);
      std::vector<int,_std::allocator<int>_>::begin(this_01);
      std::vector<int,_std::allocator<int>_>::end(this_01);
      std::copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (int *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x16c3af);
      scoped_fixed_array<char_*,_64>::~scoped_fixed_array(this_02);
      scoped_fixed_array<char_*,_64>::~scoped_fixed_array(this_02);
      scoped_fixed_array<char,_2048>::~scoped_fixed_array((scoped_fixed_array<char,_2048> *)this_02)
      ;
      scoped_fixed_array<char,_2048>::~scoped_fixed_array((scoped_fixed_array<char,_2048> *)this_02)
      ;
      return true;
    }
    ppcVar6 = __gnu_cxx::
              __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&local_a8);
    local_c0 = *ppcVar6;
    StringBuffer::clear((StringBuffer *)(in_RDI + 0x27));
    for (; cVar2 = (char)((ulong)in_stack_fffffffffffffdf8 >> 0x38), *local_c0 != '\0';
        local_c0 = local_c0 + 1) {
      iVar3 = (int)*local_c0;
      if (iVar3 == 0x25) {
        pcVar4 = local_c0 + 1;
        switch(local_c0[1]) {
        case 'L':
          local_c0 = pcVar4;
          scoped_fixed_array<char_*,_64>::get(&local_90);
          local_c8 = getIndex(this_00,p_00,column,CONCAT44(iVar3,in_stack_fffffffffffffe90));
          if (local_c8 == (char *)0x0) goto LAB_0016c2cf;
          StringBuffer::operator<<(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
          break;
        default:
          local_c0 = pcVar4;
          die::die(&local_d1);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                                  );
          poVar7 = std::operator<<(poVar7,"(");
          in_stack_fffffffffffffe48 = (ChunkFreeList<int> *)std::ostream::operator<<(poVar7,0x1a3);
          in_stack_fffffffffffffe40 = std::operator<<((ostream *)in_stack_fffffffffffffe48,") [");
          poVar7 = std::operator<<(in_stack_fffffffffffffe40,"false");
          poVar7 = std::operator<<(poVar7,"] ");
          poVar7 = std::operator<<(poVar7,"unknown meta char: ");
          in_stack_fffffffffffffe20._M_current = (int *)std::operator<<(poVar7,*local_c0);
          die::operator&(&local_d1,(ostream *)in_stack_fffffffffffffe20._M_current);
          die::~die((die *)0x16c203);
          break;
        case 'R':
          local_c0 = pcVar4;
          scoped_fixed_array<char_*,_64>::get(&local_78);
          local_d0 = getIndex(this_00,p_00,column,CONCAT44(iVar3,in_stack_fffffffffffffe90));
          if (local_d0 == (char *)0x0) goto LAB_0016c2cf;
          StringBuffer::operator<<(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
          break;
        case 'l':
          local_c0 = pcVar4;
          StringBuffer::operator<<(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
          break;
        case 'r':
          local_c0 = pcVar4;
          StringBuffer::operator<<(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
        }
      }
      else if (iVar3 == 0x5c) {
        pcVar4 = local_c0 + 1;
        local_c0 = local_c0 + 1;
        cVar2 = getEscapedChar(*pcVar4);
        in_stack_fffffffffffffe90 = CONCAT13(cVar2,(int3)in_stack_fffffffffffffe90);
        StringBuffer::operator<<
                  (in_stack_fffffffffffffe00,(char)((ulong)in_stack_fffffffffffffdf8 >> 0x38));
      }
      else {
        StringBuffer::operator<<(in_stack_fffffffffffffe00,cVar2);
      }
    }
    StringBuffer::operator<<(in_stack_fffffffffffffe00,cVar2);
    in_stack_fffffffffffffe18._M_current = (int *)StringBuffer::str((StringBuffer *)(in_RDI + 0x27))
    ;
    in_stack_fffffffffffffe14 =
         (**(code **)(*in_RDI + 0x30))(in_RDI,in_stack_fffffffffffffe18._M_current);
    if (in_stack_fffffffffffffe14 != -1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08);
    }
LAB_0016c2cf:
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator++(&local_a8);
  } while( true );
}

Assistant:

bool FeatureIndex::buildBigramFeature(LearnerPath *path,
                                      const char *rfeature,
                                      const char *lfeature) {
  scoped_fixed_array<char, BUFSIZE> rbuf;
  scoped_fixed_array<char, BUFSIZE> lbuf;
  scoped_fixed_array<char *, POSSIZE> R;
  scoped_fixed_array<char *, POSSIZE> L;

  feature_.clear();
  std::strncpy(lbuf.get(),  rfeature, lbuf.size());
  std::strncpy(rbuf.get(),  lfeature, rbuf.size());

  const size_t lsize = tokenizeCSV(lbuf.get(), L.get(), L.size());
  const size_t rsize = tokenizeCSV(rbuf.get(), R.get(), R.size());

  for (std::vector<const char*>::const_iterator it = bigram_templs_.begin();
       it != bigram_templs_.end(); ++it) {
    const char *p = *it;
    os_.clear();

    for (; *p; p++) {
      switch (*p) {
        default: os_ << *p; break;
        case '\\': os_ << getEscapedChar(*++p); break;
        case '%': {
          switch (*++p) {
            case 'L': {
              const char *r = getIndex(const_cast<char **>(&p), L.get(), lsize);
              if (!r) goto NEXT;
              os_ << r;
            } break;
            case 'R': {
              const char *r = getIndex(const_cast<char **>(&p), R.get(), rsize);
              if (!r) goto NEXT;
              os_ << r;
            } break;
            case 'l':  os_ << lfeature; break;  // use lfeature as it is
            case 'r':  os_ << rfeature; break;
            default:
              CHECK_DIE(false) << "unknown meta char: " <<  *p;
          }
        }
      }
    }

    os_ << '\0';

    ADDB(os_.str());

 NEXT: continue;
  }

  COPY_FEATURE(path->fvector);

  return true;
}